

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

void fmp4_stream::gen_splice_insert
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out_splice_insert,
               int event_id,uint32_t duration,bool splice_immediate)

{
  value_type vVar1;
  byte bVar2;
  bool bVar3;
  reference pvVar4;
  unsigned_long uVar5;
  size_type sVar6;
  int local_e8;
  int32_t or_size;
  int k_1;
  int local_d4;
  undefined1 local_d0 [4];
  int k;
  vector<unsigned_char,_std::allocator<unsigned_char>_> trailer;
  reference local_a8;
  undefined1 local_91;
  undefined1 local_90 [7];
  bool splice_immediate_flag;
  byte local_79;
  undefined1 local_78 [7];
  bool duration_flag;
  byte local_61;
  undefined1 local_60 [7];
  bool program_splice_flag;
  undefined1 local_49;
  bool out_of_network_indicator;
  bitset<8UL> b2;
  uint8_t *ptr;
  byte local_19;
  uint32_t local_18;
  uint32_t uStack_14;
  bool splice_immediate_local;
  uint32_t duration_local;
  int event_id_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_splice_insert_local;
  
  local_19 = splice_immediate;
  local_18 = duration;
  uStack_14 = event_id;
  _duration_local = out_splice_insert;
  base64_decode((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ptr,
                (string *)base64splice_insert_abi_cxx11_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (_duration_local,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ptr);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ptr);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](_duration_local,0)
  ;
  if ((local_19 & 1) != 0) {
    pvVar4[2] = pvVar4[2] + 0xff;
  }
  if ((local_19 & 1) != 0) {
    pvVar4[0xc] = pvVar4[0xc] + 0xff;
  }
  b2.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)((long)pvVar4 + 0xe);
  anon_unknown.dwarf_27f3a::fmp4_write_uint32(uStack_14,(char *)b2.super__Base_bitset<1UL>._M_w);
  b2.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)((long)b2.super__Base_bitset<1UL>._M_w + 5);
  std::bitset<8UL>::bitset
            ((bitset<8UL> *)&stack0xffffffffffffffb8,(ulong)*(byte *)b2.super__Base_bitset<1UL>._M_w
            );
  std::bitset<8UL>::operator[]((bitset<8UL> *)local_60,(size_t)&stack0xffffffffffffffb8);
  bVar3 = std::bitset::reference::operator_cast_to_bool((reference *)local_60);
  std::bitset<8UL>::reference::~reference((reference *)local_60);
  local_49 = bVar3;
  std::bitset<8UL>::operator[]((bitset<8UL> *)local_78,(size_t)&stack0xffffffffffffffb8);
  bVar3 = std::bitset::reference::operator_cast_to_bool((reference *)local_78);
  std::bitset<8UL>::reference::~reference((reference *)local_78);
  local_61 = bVar3;
  std::bitset<8UL>::operator[]((bitset<8UL> *)local_90,(size_t)&stack0xffffffffffffffb8);
  bVar3 = std::bitset::reference::operator_cast_to_bool((reference *)local_90);
  std::bitset<8UL>::reference::~reference((reference *)local_90);
  local_79 = bVar3;
  std::bitset<8UL>::operator[]((bitset<8UL> *)&local_a8,(size_t)&stack0xffffffffffffffb8);
  bVar3 = std::bitset::reference::operator_cast_to_bool((reference *)&local_a8);
  std::bitset<8UL>::reference::~reference(&local_a8);
  bVar2 = local_19;
  local_91 = bVar3;
  std::bitset<8UL>::operator[]
            ((bitset<8UL> *)
             &trailer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(size_t)&stack0xffffffffffffffb8);
  std::bitset<8UL>::reference::operator=
            ((reference *)
             &trailer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(bool)(bVar2 & 1));
  std::bitset<8UL>::reference::~reference
            ((reference *)
             &trailer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  uVar5 = std::bitset<8UL>::to_ulong((bitset<8UL> *)&stack0xffffffffffffffb8);
  *(char *)b2.super__Base_bitset<1UL>._M_w = (char)uVar5;
  if (((local_61 & 1) == 0) || ((local_19 & 1) == 0)) {
    b2.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)((long)b2.super__Base_bitset<1UL>._M_w + 3)
    ;
    if ((local_79 & 1) != 0) {
      anon_unknown.dwarf_27f3a::fmp4_write_uint32(local_18,(char *)b2.super__Base_bitset<1UL>._M_w);
    }
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
    local_d4 = 0x15;
    while( true ) {
      sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(_duration_local);
      if (sVar6 - 1 <= (ulong)(long)local_d4) break;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (_duration_local,(long)local_d4);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0,pvVar4);
      local_d4 = local_d4 + 1;
    }
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0,0);
    b2.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)((long)pvVar4 + 1);
    if ((local_79 & 1) != 0) {
      anon_unknown.dwarf_27f3a::fmp4_write_uint32(local_18,(char *)b2.super__Base_bitset<1UL>._M_w);
      b2.super__Base_bitset<1UL>._M_w =
           (_Base_bitset<1UL>)((long)b2.super__Base_bitset<1UL>._M_w + 4);
    }
    local_e8 = 0;
    while( true ) {
      sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
      if (sVar6 <= (ulong)(long)local_e8) break;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0,
                          (long)local_e8);
      vVar1 = *pvVar4;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (_duration_local,(long)(local_e8 + 0x14));
      *pvVar4 = vVar1;
      local_e8 = local_e8 + 1;
    }
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(_duration_local);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (_duration_local,(long)((int)sVar6 + -1));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
  }
  return;
}

Assistant:

void gen_splice_insert(std::vector<uint8_t> &out_splice_insert,int event_id, uint32_t duration, bool splice_immediate)
	{
		out_splice_insert = base64_decode(base64splice_insert);

		uint8_t *ptr = &out_splice_insert[0];
		if (splice_immediate)
		{
			*(ptr + 2) = *(ptr + 2) - 1;
		}

		ptr += 12;
		
		if (splice_immediate)
		{
			*(ptr ) = *(ptr) - 1;
		}

		ptr += 2;
		fmp4_write_uint32(event_id, (char *)ptr);
		ptr += 5;
		
		std::bitset<8> b2(*ptr);
		bool out_of_network_indicator = b2[7];
		bool program_splice_flag = b2[6];
		bool duration_flag = b2[5];
		bool splice_immediate_flag = b2[4];
		b2[4] = splice_immediate;
		*ptr = (unsigned char)b2.to_ulong();
		
		if (program_splice_flag && splice_immediate)
		{
			std::vector<uint8_t> trailer;
			for (int k = 21; k < out_splice_insert.size() - 1; k++)
			{
				trailer.push_back(out_splice_insert[k]);
			}
			ptr = &trailer[0];
			ptr++;
			if (duration_flag)
			{
				fmp4_write_uint32(duration, (const char*)ptr);
				ptr += 4;
			}
			for (int k = 0; k < trailer.size(); k++)
			{
				out_splice_insert[k + 20] = trailer[k];
			}
			int32_t or_size = out_splice_insert.size();
			out_splice_insert.resize(or_size - 1);
			return;
		}
		
		ptr+=3;
	
		if (duration_flag)
		{
			fmp4_write_uint32(duration, (const char *)ptr);
			ptr += 4;
		}
	
		//uint32_t crc = 0;
		//crc32_fmp4(&out_splice_insert[0], out_splice_insert.size() - 4, &crc);

		//ptr = &out_splice_insert[out_splice_insert.size() - 4];
		//fmp4_write_uint32(crc, (const char*)ptr);
		//uint32_t table[256];
		//crc::crc32::generate_table(table);

		//char* ptr2 = (char*)&out_splice_insert[0];
		//uint16_t slen = out_splice_insert.size() - 4;
		//printf("Size of Data struct is: %u\n", slen);                 // 16 bytes

		//uint32_t CRC = 0;
		//for (int cnt = 0; cnt < slen; cnt++) {
		//	CRC = crc::crc32::update(table, CRC, ptr2, 1);
		//	ptr2++;
		//}
		//// get the original crc
		//uint32_t or_crc = fmp4_read_uint32(ptr2);
		////fmp4_write_uint32(CRC, (char*)ptr2);
		//printf("Piece-wise crc32 of struct Data is: 0x%X \n", CRC);
	}